

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall
TasGrid::GridFourier::getInterpolationWeights(GridFourier *this,double *x,double *weights)

{
  allocator<int> *this_00;
  int iVar1;
  int iVar2;
  value_type vVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  size_type __n;
  reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  int *piVar12;
  reference pvVar13;
  reference this_01;
  complex<double> *this_02;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  pointer __i;
  pointer pvVar14;
  double dVar15;
  MultiIndexSet *local_208;
  complex<double> local_1f8;
  double local_1e8;
  complex<double> local_1e0;
  complex<double> local_1d0;
  double local_1c0;
  complex<double> local_1b8;
  complex<double> local_1a8;
  undefined1 local_198 [20];
  int local_184;
  int local_180;
  int offset;
  int r;
  int j_3;
  double fftprod;
  int t;
  int i_2;
  double tensorw;
  undefined1 local_158 [8];
  vector<int,_std::allocator<int>_> p;
  int j_2;
  vector<int,_std::allocator<int>_> num_oned_points_1;
  int num_tensor_points;
  int *levels;
  int local_108;
  int n;
  int i_1;
  int j_1;
  undefined8 local_f8;
  double local_f0;
  double theta_1;
  int k;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  numerator_cache;
  int local_b4;
  undefined1 local_b0 [4];
  int j;
  complex<double> step;
  double theta;
  undefined8 uStack_90;
  int local_84;
  int local_80;
  int num_oned_points;
  int i;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  expcache;
  double dStack_58;
  int maxl;
  undefined1 local_40 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  index_map;
  MultiIndexSet *work;
  double *weights_local;
  double *x_local;
  GridFourier *this_local;
  
  bVar6 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar6) {
    local_208 = &(this->super_BaseCanonicalGrid).needed;
  }
  else {
    local_208 = &(this->super_BaseCanonicalGrid).points;
  }
  index_map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_208;
  generateIndexingMap((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_40,this);
  iVar7 = MultiIndexSet::getNumIndexes
                    ((MultiIndexSet *)
                     index_map.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  dStack_58 = 0.0;
  ::std::fill_n<double*,int,double>(weights,iVar7,&stack0xffffffffffffffa8);
  iVar7 = MultiIndexSet::getMaxIndex(&this->active_tensors);
  expcache.
  super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar7 + 1;
  __n = (size_type)
        expcache.
        super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  ::std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
  allocator((allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *
            )((long)&num_oned_points + 3));
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
            *)&i,__n,
           (allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *)
           ((long)&num_oned_points + 3));
  ::std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
  ~allocator((allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
              *)((long)&num_oned_points + 3));
  for (local_80 = 0;
      local_80 <
      expcache.
      super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_80 = local_80 + 1) {
    local_84 = OneDimensionalWrapper::getNumPoints(&this->wrapper,local_80);
    pvVar8 = ::std::
             vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           *)&i,(long)local_80);
    ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (pvVar8,(long)local_84);
    ::std::complex<double>::complex((complex<double> *)&theta,1.0,0.0);
    pvVar8 = ::std::
             vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           *)&i,(long)local_80);
    pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                       (pvVar8,0);
    *(double *)pvVar9->_M_value = theta;
    *(undefined8 *)(pvVar9->_M_value + 8) = uStack_90;
    step._M_value._8_8_ = -6.283185307179586 / (double)local_84;
    dVar15 = cos((double)step._M_value._8_8_);
    __i = (pointer)sin((double)step._M_value._8_8_);
    ::std::complex<double>::complex((complex<double> *)local_b0,dVar15,(double)__i);
    for (local_b4 = 1; local_b4 < local_84; local_b4 = local_b4 + 1) {
      pvVar8 = ::std::
               vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                             *)&i,(long)local_80);
      pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
               operator[](pvVar8,(long)(local_b4 + -1));
      ::std::operator*(pvVar9,(complex<double> *)local_b0);
      pvVar14 = (pointer)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      numerator_cache.
      super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar14;
      pvVar8 = ::std::
               vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                             *)&i,(long)local_80);
      pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
               operator[](pvVar8,(long)local_b4);
      *(pointer *)pvVar9->_M_value =
           numerator_cache.
           super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(pointer *)(pvVar9->_M_value + 8) = __i;
      __i = pvVar14;
    }
  }
  iVar7 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
  allocator((allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *
            )((long)&theta_1 + 7));
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
            *)&k,(long)iVar7,
           (allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *)
           ((long)&theta_1 + 7));
  ::std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
  ~allocator((allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
              *)((long)&theta_1 + 7));
  for (theta_1._0_4_ = 0; theta_1._0_4_ < (this->super_BaseCanonicalGrid).num_dimensions;
      theta_1._0_4_ = theta_1._0_4_ + 1) {
    pvVar8 = ::std::
             vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           *)&k,(long)theta_1._0_4_);
    pvVar10 = ::std::vector<int,_std::allocator<int>_>::operator[]
                        (&this->max_levels,(long)theta_1._0_4_);
    ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (pvVar8,(long)(*pvVar10 + 1));
    local_f0 = x[theta_1._0_4_] * 6.283185307179586;
    dVar15 = cos(local_f0);
    dVar4 = sin(local_f0);
    ::std::complex<double>::complex((complex<double> *)&i_1,dVar15,dVar4);
    pvVar8 = ::std::
             vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           *)&k,(long)theta_1._0_4_);
    pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                       (pvVar8,0);
    *(undefined8 *)pvVar9->_M_value = _i_1;
    *(undefined8 *)(pvVar9->_M_value + 8) = local_f8;
    n = 1;
    while( true ) {
      pvVar10 = ::std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->max_levels,(long)theta_1._0_4_);
      if (*pvVar10 + 1 <= n) break;
      pvVar8 = ::std::
               vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                             *)&k,(long)theta_1._0_4_);
      pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
               operator[](pvVar8,(long)(n + -1));
      pvVar8 = ::std::
               vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                             *)&k,(long)theta_1._0_4_);
      pvVar11 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                operator[](pvVar8,(long)n);
      *(undefined8 *)pvVar11->_M_value = *(undefined8 *)pvVar9->_M_value;
      *(undefined8 *)(pvVar11->_M_value + 8) = *(undefined8 *)(pvVar9->_M_value + 8);
      local_108 = 0;
      while( true ) {
        iVar7 = OneDimensionalWrapper::getNumPoints(&this->wrapper,n + -1);
        if (iVar7 <= local_108) break;
        pvVar8 = ::std::
                 vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                               *)&k,(long)theta_1._0_4_);
        pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](pvVar8,0);
        pvVar8 = ::std::
                 vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                               *)&k,(long)theta_1._0_4_);
        pvVar11 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                  operator[](pvVar8,(long)n);
        ::std::complex<double>::operator*=(pvVar11,pvVar9);
        local_108 = local_108 + 1;
      }
      n = n + 1;
    }
  }
  levels._4_4_ = 0;
  while( true ) {
    iVar7 = MultiIndexSet::getNumIndexes(&this->active_tensors);
    if (iVar7 <= levels._4_4_) break;
    piVar12 = MultiIndexSet::getIndex(&this->active_tensors,levels._4_4_);
    num_oned_points_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
    iVar7 = (this->super_BaseCanonicalGrid).num_dimensions;
    this_00 = (allocator<int> *)
              ((long)&p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<int>::allocator(this_00);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&j_2,(long)iVar7,this_00);
    ::std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    for (p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        (int)p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage < (this->super_BaseCanonicalGrid).num_dimensions;
        p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage + 1) {
      iVar7 = OneDimensionalWrapper::getNumPoints
                        (&this->wrapper,
                         piVar12[(int)p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage]);
      pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&j_2,
                           (long)(int)p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
      *pvVar13 = iVar7;
      pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&j_2,
                           (long)(int)p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
      num_oned_points_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           *pvVar13 *
           num_oned_points_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    iVar7 = (this->super_BaseCanonicalGrid).num_dimensions;
    ::std::allocator<int>::allocator((allocator<int> *)((long)&tensorw + 7));
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_158,(long)iVar7,
               (allocator<int> *)((long)&tensorw + 7));
    ::std::allocator<int>::~allocator((allocator<int> *)((long)&tensorw + 7));
    pvVar10 = ::std::vector<int,_std::allocator<int>_>::operator[]
                        (&this->active_w,(long)levels._4_4_);
    dVar15 = (double)num_oned_points_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
    _t = (double)*pvVar10 / dVar15;
    for (fftprod._4_4_ = 0;
        fftprod._4_4_ <
        num_oned_points_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; fftprod._4_4_ = fftprod._4_4_ + 1) {
      fftprod._0_4_ = fftprod._4_4_;
      _r = 1.0;
      offset = (this->super_BaseCanonicalGrid).num_dimensions;
      while (dVar5 = _t, iVar7 = fftprod._0_4_, dVar4 = _r, offset = offset + -1, -1 < offset) {
        pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&j_2,(long)offset);
        iVar1 = *pvVar13;
        local_180 = iVar7 % iVar1;
        pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&j_2,(long)offset);
        iVar2 = *pvVar13;
        pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&j_2,(long)offset);
        local_184 = (((iVar7 % iVar1) * (iVar2 + 1)) / 2) % *pvVar13;
        pvVar8 = ::std::
                 vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                               *)&k,(long)offset);
        pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](pvVar8,0);
        pvVar8 = ::std::
                 vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                               *)&i,(long)piVar12[offset]);
        pvVar11 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                  operator[](pvVar8,(long)local_180);
        ::std::operator*(pvVar9,pvVar11);
        this_02 = (complex<double> *)local_198;
        local_198._8_8_ = dVar15;
        ::std::complex<double>::real_abi_cxx11_(this_02);
        ::std::abs((int)this_02);
        dVar15 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        if (1e-12 <= dVar15) {
          local_1c0 = 1.0;
          pvVar8 = ::std::
                   vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                 *)&k,(long)offset);
          pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                   operator[](pvVar8,(long)piVar12[offset]);
          pvVar8 = ::std::
                   vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                 *)&i,(long)piVar12[offset]);
          pvVar11 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                    operator[](pvVar8,(long)local_184);
          ::std::operator*(pvVar9,pvVar11);
          ::std::operator-(&local_1c0,&local_1d0);
          local_1e8 = 1.0;
          pvVar8 = ::std::
                   vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                 *)&k,(long)offset);
          pvVar9 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                   operator[](pvVar8,0);
          pvVar8 = ::std::
                   vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                   ::operator[]((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                 *)&i,(long)piVar12[offset]);
          pvVar11 = ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                    operator[](pvVar8,(long)local_180);
          ::std::operator*(pvVar9,pvVar11);
          ::std::operator-(&local_1e8,&local_1f8);
          ::std::operator/(&local_1b8,&local_1e0);
          dVar4 = ::std::complex<double>::real_abi_cxx11_(&local_1a8);
          dVar15 = -1.0;
          _r = (dVar4 + dVar4 + -1.0) * _r;
        }
        else {
          pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&j_2,(long)offset);
          _r = (double)*pvVar13 * _r;
        }
        this_01 = ::std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)local_40,(long)piVar12[offset]);
        pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_180);
        vVar3 = *pvVar13;
        pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_158,(long)offset);
        *pvVar13 = vVar3;
        pvVar13 = ::std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&j_2,(long)offset);
        fftprod._0_4_ = fftprod._0_4_ / *pvVar13;
      }
      iVar7 = MultiIndexSet::getSlot
                        ((MultiIndexSet *)
                         index_map.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<int,_std::allocator<int>_> *)local_158);
      dVar15 = weights[iVar7];
      weights[iVar7] = dVar5 * dVar4 + dVar15;
    }
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_158);
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&j_2);
    levels._4_4_ = levels._4_4_ + 1;
  }
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             *)&k);
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector((vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             *)&i);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_40);
  return;
}

Assistant:

void GridFourier::getInterpolationWeights(const double x[], double weights[]) const {
    // if Fourier coefficient are c, Data from the target function is f, and values of the basis functions are b
    // then we have c = A * f (where A is both the Fourier transform and the reindexing)
    // and the value of the interpolant is result = <c, b> = <A f, b> = <f, A^* b>, where A^* is conjugate transpose
    // However, we consider only the real values (the complex ones add-up to zero), thus we really need A^T (regular transpose)
    // The Fourier transform is symmetric with respect to regular transpose, which leaves only the indexing
    // Take the basis functions, reindex and reorder to a data strucutre, take FFT, reindex and reorder into the weights
    //
    //
    // This code uses a O(N) algorithm instead of an O(N log N) FFT. On a 1D tensor with N=3^l points, we must compute the
    // Fourier transform of
    //      {x_n} = e^(2 \pi i x * {0,1,2, ..., (N-1)/2, -(N-1)/2, ..., -2, -1}).           (componentwise operations)
    // The FFT is
    //      X[m] = \sum_{j=0}^{N-1} e^{-2 \pi i j m / N} x_n
    //           = ( \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} )
    //                + ( \sum_{j=1}^{(N-1)/2} e^{2 \pi i j m / N} e^{-2 \pi i x j} )
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} ] - 1
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} (e^{2 \pi i (x-m/N)})^j ] - 1
    //           = 2 * Re[ \frac{1 - e^{2 \pi i (x-m/N) (N+1)/2}}{1 - e^{2 \pi i (x-m/N)}} ] - 1
    // The cost is mainly driven by evaluating the complex exponentials, so we compute what we can at the beginning and
    // park it in a cache.

    const MultiIndexSet &work = (points.empty()) ? needed : points;
    std::vector<std::vector<int>> index_map = generateIndexingMap();

    std::fill_n(weights, work.getNumIndexes(), 0.0);

    // compute what we need for e^{-2 \pi i m / N}
    int maxl = active_tensors.getMaxIndex() + 1;
    std::vector<std::vector<std::complex<double>>> expcache(maxl);
    for(int i=0; i<maxl; i++){
        int num_oned_points = wrapper.getNumPoints(i);
        expcache[i].resize(num_oned_points);
        expcache[i][0] = std::complex<double>(1.0, 0.0);
        double theta = -2.0 * Maths::pi / ((double) num_oned_points);       // step angle
        std::complex<double> step(std::cos(theta), std::sin(theta));
        for(int j=1; j<num_oned_points; j++) expcache[i][j] = expcache[i][j-1] * step;
    }

    // compute what we need for e^{2 \pi i x (N+1)/2}
    std::vector<std::vector<std::complex<double>>> numerator_cache(num_dimensions);
    for(int k=0; k<num_dimensions; k++){
        numerator_cache[k].resize(max_levels[k]+1);
        double theta = 2.0 * Maths::pi * x[k];
        numerator_cache[k][0] = std::complex<double>(std::cos(theta), std::sin(theta));
        for(int j=1; j<max_levels[k]+1; j++){
            numerator_cache[k][j] = numerator_cache[k][j-1];
            for(int i=0; i<wrapper.getNumPoints(j-1); i++) numerator_cache[k][j] *= numerator_cache[k][0];
        }
    }

    for(int n=0; n<active_tensors.getNumIndexes(); n++){
        const int *levels = active_tensors.getIndex(n);
        int num_tensor_points = 1;
        std::vector<int> num_oned_points(num_dimensions);
        for(int j=0; j<num_dimensions; j++){
            num_oned_points[j] = wrapper.getNumPoints(levels[j]);
            num_tensor_points *= num_oned_points[j];
        }
        std::vector<int> p(num_dimensions);

        double tensorw = ((double) active_w[n]) / ((double) num_tensor_points);
        for(int i=0; i<num_tensor_points; i++){
            // We interpret this "i" as running through the spatial indexing; convert to internal
            int t=i;
            double fftprod = 1.0;
            for(int j=num_dimensions-1; j>=0; j--){ // here p is the index of the spacial point in Tasmanian indexing
                int r = t % num_oned_points[j];
                int offset = (r*(num_oned_points[j]+1)/2) % num_oned_points[j];     // in order to fetch reduced form of (N+1)*r/(2*N)

                if (std::abs(1.0 - (numerator_cache[j][0] * expcache[levels[j]][r]).real()) <  Maths::num_tol){
                    // we're evaluating the basis functions at a node; take care of zero-divide
                    fftprod *= num_oned_points[j];
                }else{
                    fftprod *= 2.0 * ( (1.0 - numerator_cache[j][levels[j]] * expcache[levels[j]][offset])
                                / (1.0 - numerator_cache[j][0] * expcache[levels[j]][r]) ).real() - 1.0;
                }

                p[j] = index_map[levels[j]][r];
                t /= num_oned_points[j];
            }
            weights[work.getSlot(p)] += (tensorw * fftprod);
        }
    }
}